

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pearson.c
# Opt level: O1

uint8_t pearson_get(uint8_t *data,size_t data_len)

{
  byte *pbVar1;
  byte bVar2;
  ulong uVar3;
  size_t sVar4;
  
  if (data_len != 0) {
    sVar4 = 0;
    uVar3 = data_len & 0xffffffff;
    do {
      pbVar1 = data + sVar4;
      bVar2 = (byte)uVar3;
      uVar3 = (ulong)permutation_table[bVar2 ^ *pbVar1];
      sVar4 = sVar4 + 1;
    } while (data_len != sVar4);
    return permutation_table[bVar2 ^ *pbVar1];
  }
  return '\0';
}

Assistant:

uint8_t pearson_get(const uint8_t *data, size_t data_len)
{
	uint8_t ret = data_len % 256;

	if (data_len == 0)
		return 0;

	do {
		ret = permutation_table[ret ^ *data++];
	} while (--data_len > 0);

	return ret;
}